

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O1

_Bool options_restore_custom(player_options *opts,int page)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  ang_file *f;
  char *pcVar4;
  char *pcVar5;
  size_t __n;
  _Bool *p_Var6;
  int opt;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  char file_name [80];
  char buf [1024];
  char path [1024];
  char local_888 [80];
  char local_838 [1024];
  char local_438 [1032];
  
  if ((uint)page < 5) {
    pcVar9 = *(char **)(&DAT_002ce6f8 + (ulong)(uint)page * 8);
  }
  else {
    pcVar9 = "unknown";
  }
  strnfmt(local_888,0x50,"customized_%s_options.txt",pcVar9);
  path_build(local_438,0x400,ANGBAND_DIR_USER,local_888);
  _Var2 = file_exists(local_438);
  if (_Var2) {
    f = file_open(local_438,MODE_READ,FTYPE_TEXT);
    if (f == (ang_file *)0x0) {
      _Var2 = false;
    }
    else {
      _Var2 = file_getl(f,local_838,0x400);
      if (_Var2) {
        uVar8 = 1;
        do {
          pcVar4 = strstr(local_838,"option:");
          if (pcVar4 == (char *)0x0) {
            pcVar5 = strchr(local_838,0x23);
            if (pcVar5 != (char *)0x0) goto LAB_0019d4f7;
LAB_0019d4fa:
            _Var2 = contains_only_spaces(local_838);
            if (!_Var2) {
LAB_0019d506:
              msg("Line %d of the customized %s options is not parseable.",uVar8,pcVar9);
            }
          }
          else {
            *pcVar4 = '\0';
            pcVar5 = strchr(local_838,0x23);
            if (pcVar5 != (char *)0x0) {
LAB_0019d4f7:
              *pcVar5 = '\0';
              goto LAB_0019d4fa;
            }
            _Var2 = contains_only_spaces(local_838);
            if (!_Var2) goto LAB_0019d506;
            pcVar4 = pcVar4 + 7;
            iVar10 = 0;
            do {
              if (iVar10 < 0x2d) {
                if ((options[iVar10].type == page) &&
                   (pcVar5 = options[iVar10].name, pcVar5 != (char *)0x0)) {
                  __n = strlen(pcVar5);
                  iVar3 = strncmp(pcVar5,pcVar4,__n);
                  if ((iVar3 == 0) && (pcVar4[__n] == ':')) {
                    iVar3 = strncmp("yes",pcVar4 + __n + 1,3);
                    if ((iVar3 == 0) && (_Var2 = contains_only_spaces(pcVar4 + __n + 4), _Var2)) {
                      opts->opt[iVar10] = true;
                    }
                    else {
                      iVar3 = strncmp("no",pcVar4 + __n + 1,2);
                      if ((iVar3 == 0) && (_Var2 = contains_only_spaces(pcVar4 + __n + 3), _Var2)) {
                        opts->opt[iVar10] = false;
                      }
                      else {
                        msg("Value at line %d of the customized %s options is not yes or no.",uVar8,
                            pcVar9);
                      }
                    }
                    bVar1 = true;
                    goto LAB_0019d48c;
                  }
                }
                iVar10 = iVar10 + 1;
                bVar1 = false;
              }
              else {
                msg("Unrecognized option at line %d of the customized %s options.",uVar8,pcVar9);
                bVar1 = true;
              }
LAB_0019d48c:
            } while (!bVar1);
          }
          uVar8 = (ulong)((int)uVar8 + 1);
          _Var2 = file_getl(f,local_838,0x400);
        } while (_Var2);
      }
      _Var2 = file_close(f);
    }
  }
  else {
    p_Var6 = &options[0].normal;
    lVar7 = 0;
    do {
      if (*(int *)(p_Var6 + -4) == page) {
        opts->opt[lVar7] = *p_Var6;
      }
      lVar7 = lVar7 + 1;
      p_Var6 = p_Var6 + 0x18;
    } while (lVar7 != 0x2d);
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool options_restore_custom(struct player_options *opts, int page)
{
	const char *page_name = option_type_name(page);
	char path[1024], buf[1024], file_name[80];
	ang_file *f;
	int linenum;

	strnfmt(file_name, sizeof(file_name), "customized_%s_options.txt",
		page_name);
	path_build(path, sizeof(path), ANGBAND_DIR_USER, file_name);
	if (!file_exists(path)) {
		options_restore_maintainer(opts, page);
		return true;
	}

	/*
	 * Could use run_parser(), but that exits the application if
	 * there are syntax errors.  Therefore, use our own parsing.
	 */
	f = file_open(path, MODE_READ, FTYPE_TEXT);
	if (!f) {
		return false;
	}
	linenum = 1;
	while (file_getl(f, buf, sizeof(buf))) {
		char *sub = strstr(buf, "option:"), *com;
		int opt;

		if (!sub) {
			/*
			 * If it isn't an option, it should be a comment or
			 * whitespace.
			 */
			sub = strchr(buf, '#');

			if (sub) {
				*sub = '\0';
			}
			if (!contains_only_spaces(buf)) {
				msg("Line %d of the customized %s options is "
					"not parseable.", linenum, page_name);
			}
			++linenum;
			continue;
		}

		*sub = '\0';
		/* Ignore if the "option:" is embedded in a comment. */
		com = strchr(buf, '#');
		if (com) {
			*com = '\0';
			if (!contains_only_spaces(buf)) {
				msg("Line %d of the customized %s options is "
					"not parseable.", linenum, page_name);
			}
			++linenum;
			continue;
		}
		if (!contains_only_spaces(buf)) {
			msg("Line %d of the customized %s options is not "
					"parseable.", linenum, page_name);
			++linenum;
			continue;
		}

		/* Try to find the option. */
		sub += 7;
		opt = 0;
		while (1) {
			size_t lname;

			if (opt >= OPT_MAX) {
				msg("Unrecognized option at line %d of the "
					"customized %s options.", linenum,
					page_name);
				break;
			}
			if (options[opt].type != page || !options[opt].name) {
				++opt;
				continue;
			}
			lname = strlen(options[opt].name);
			if (strncmp(options[opt].name, sub, lname) == 0
					&& sub[lname] == ':') {
				if (strncmp("yes", sub + lname + 1, 3) == 0
						&& contains_only_spaces(sub + lname + 4)) {
					(*opts).opt[opt] = true;
				} else if (strncmp("no", sub + lname + 1, 2) == 0
						&& contains_only_spaces(sub + lname + 3)) {
					(*opts).opt[opt] = false;
				} else {
					msg("Value at line %d of the "
						"customized %s options is not "
						"yes or no.", linenum,
						page_name);
				}
				break;
			}
			++opt;
		}
		++linenum;
	}

	if (!file_close(f)) {
		return false;
	}

	return true;
}